

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doit_fast<frozen::basic_string<char>const*,31ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  bool bVar1;
  basic_string<char> *pbVar2;
  long local_50;
  basic_string<char> *next_it;
  basic_string<char> *it;
  unsigned_long step;
  basic_string<char> *first_local;
  LowerBound<frozen::basic_string<char>,_std::less<frozen::basic_string<char>_>_> *this_local;
  
  bVar1 = std::less<frozen::basic_string<char>_>::operator()
                    (*(less<frozen::basic_string<char>_> **)(this + 8),
                     (basic_string<char> *)(first + 0xf0),*(basic_string<char> **)this);
  local_50 = first;
  if (bVar1) {
    local_50 = first + 0x100;
  }
  pbVar2 = doit_fast<frozen::basic_string<char>const*,15ul>(this,local_50);
  return pbVar2;
}

Assistant:

inline constexpr ForwardIt doit_fast(ForwardIt first,
                                  std::integral_constant<std::size_t, N>) {
    auto constexpr step = N / 2;
    static_assert(N/2 == N - N / 2 - 1, "power of two minus 1");
    auto it = first + step;
    auto next_it = compare_(*it, value_) ? it + 1 : first;
    return doit_fast(next_it, std::integral_constant<std::size_t, N / 2>{});
  }